

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

void test_normal(cache *Cache)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int in_ECX;
  record *prVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  int i_1;
  record *record;
  record *prVar7;
  
  prVar7 = Cache->records;
  uVar2 = Cache->length;
  prVar4 = prVar7;
  for (uVar5 = 0; uVar6 = uVar2, uVar2 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = prVar4->next;
    uVar6 = uVar5;
    if ((long)iVar1 == -1) break;
    prVar4 = prVar7 + iVar1;
    in_ECX = iVar1;
  }
  if ((uVar2 == (uVar6 & 0xffffffff)) && (prVar4->next < 1)) {
    uVar5 = 0;
    for (; (uVar6 = uVar2, uVar2 != uVar5 && (uVar6 = uVar5, -1 < (long)prVar4->last));
        prVar4 = prVar7 + prVar4->last) {
      uVar5 = uVar5 + 1;
    }
    if ((uVar2 == (uVar6 & 0xffffffff)) &&
       ((uVar2 < 2 || ((Cache->first == prVar7->next && (Cache->last == in_ECX)))))) {
      return;
    }
  }
  else {
    uVar5 = 0;
    for (; (uVar5 < uVar2 && (lVar3 = (long)prVar7->next, lVar3 != -1)); prVar7 = prVar7 + lVar3) {
      prVar7 = Cache->records;
      printf("%d-",(ulong)(uint)prVar7[lVar3].next);
      uVar5 = uVar5 + 1;
      uVar2 = Cache->length;
    }
  }
  exit(1);
}

Assistant:

void test_normal(cache* Cache) {
  struct record *record = &Cache->records[LRU_BUFFER_HEAD_POINT];
  int count = 0, last;
  for (int i = 0; i < Cache->length && record->next != -1; i++, count++) {
    last = record->next;
    record = &Cache->records[record->next];
  }
  if (count != Cache->length || record->next > 0) {
    #ifdef LOG_INCLUDED
    log_error("error1: length:%d,count=%d, record->next:%d,last.next:%d\n",
           (int)Cache->length, count, record->next, Cache->records[last].next);
    #endif
    struct record *record = &Cache->records[LRU_BUFFER_HEAD_POINT];
    int count = 0, last;
    for (int i = 0; i < Cache->length && record->next != -1; i++) {
      last = record->next;
      record = &Cache->records[record->next];
      printf("%d-", record->next);
    }
    exit(EXIT_FAILURE);
  }
  count = 0;
  for (int i = 0; i < Cache->length && record->last >= 0; i++, count++) {
    record = &Cache->records[record->last];
  }

  if (count != Cache->length) {
    #ifdef LOG_INCLUDED
    log_error("error2:%d\n", count);
    #endif
    exit(EXIT_FAILURE);
  }
  int first = Cache->records[LRU_BUFFER_HEAD_POINT].next;
  if (Cache->length > 1 && (Cache->first != first || Cache->last != last)) {
    #ifdef LOG_INCLUDED
    log_error("error3");
    #endif
    exit(EXIT_FAILURE);
  }
  #ifdef LOG_INCLUDED
  log_debug("check good\n");
  #endif
}